

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int Fill;
  uint uVar6;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  uint uVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  
  uVar8 = *(ulong *)pObj;
  uVar6 = (uint)uVar8;
  uVar5 = uVar6 & 0x1fffffff;
  uVar7 = (uint)(uVar8 >> 0x20) & 0x1fffffff;
  if (((-1 < (int)uVar6) && (uVar5 != 0x1fffffff)) && (uVar5 == uVar7)) {
    Gia_ObjSetBufLevel(p,pObj);
    return;
  }
  pGVar4 = p->pObjs;
  if ((pGVar4 <= pObj) && (pGVar9 = pGVar4 + p->nObjs, pObj < pGVar9)) {
    if ((p->pMuxes == (uint *)0x0) ||
       (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555] == 0)) {
      uVar8 = uVar8 & 0x1fffffff;
      if (uVar8 == 0x1fffffff || (int)uVar6 < 0) {
        if ((int)uVar8 != 0x1fffffff && -1 < (int)uVar6) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x20e,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
        }
      }
      else {
        pGVar1 = pObj + -uVar8;
        if (uVar5 < uVar7) {
          if (pGVar9 <= pGVar1 || pGVar1 < pGVar4) goto LAB_007456f7;
          uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,uVar5);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745716;
          pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
          pGVar9 = p->pObjs;
          if ((pGVar4 < pGVar9) || (pGVar9 + p->nObjs <= pGVar4)) goto LAB_007456f7;
          iVar2 = pVVar10->pArray[uVar6 & 0x7fffffff];
          uVar6 = (int)((long)pGVar4 - (long)pGVar9 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill_00);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745716;
          pGVar4 = p->pObjs;
          if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_007456f7;
          iVar11 = pVVar10->pArray[uVar6 & 0x7fffffff];
          uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill_01);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745735;
          if (iVar11 < iVar2) {
            iVar11 = iVar2;
          }
          iVar11 = iVar11 + 2;
        }
        else {
          if (pGVar9 <= pGVar1 || pGVar1 < pGVar4) goto LAB_007456f7;
          uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,uVar5);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745716;
          pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
          pGVar9 = p->pObjs;
          if ((pGVar4 < pGVar9) || (pGVar9 + p->nObjs <= pGVar4)) goto LAB_007456f7;
          iVar2 = pVVar10->pArray[uVar6 & 0x7fffffff];
          uVar6 = (int)((long)pGVar4 - (long)pGVar9 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill_02);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745716;
          pGVar4 = p->pObjs;
          if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_007456f7;
          iVar11 = pVVar10->pArray[uVar6 & 0x7fffffff];
          uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill_03);
          if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745735;
          if (iVar11 < iVar2) {
            iVar11 = iVar2;
          }
          iVar11 = iVar11 + 1;
        }
        pVVar10->pArray[uVar6 & 0x7fffffff] = iVar11;
      }
      return;
    }
    pGVar1 = pObj + -(ulong)(uVar6 & 0x1fffffff);
    if ((pGVar4 <= pGVar1) && (pGVar1 < pGVar9)) {
      uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
      pVVar10 = p->vLevels;
      Vec_IntFillExtra(pVVar10,uVar6 + 1,uVar5);
      if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) {
LAB_00745716:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar9 = p->pObjs;
      if ((pGVar9 <= pGVar4) && (pGVar4 < pGVar9 + p->nObjs)) {
        iVar2 = pVVar10->pArray[uVar6 & 0x7fffffff];
        uVar6 = (int)((long)pGVar4 - (long)pGVar9 >> 2) * -0x55555555;
        pVVar10 = p->vLevels;
        Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill);
        if (((int)uVar6 < 0) || (pVVar10->nSize <= (int)uVar6)) goto LAB_00745716;
        iVar11 = pVVar10->pArray[uVar6 & 0x7fffffff];
        pGVar4 = p->pObjs;
        if (p->pMuxes == (uint *)0x0) {
          pGVar9 = (Gia_Obj_t *)0x0;
          uVar6 = 0;
        }
        else {
          if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_007456f7;
          uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
          if ((int)uVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          uVar6 = uVar6 >> 1;
          if (p->nObjs <= (int)uVar6) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar9 = pGVar4 + uVar6;
        }
        if ((pGVar4 <= pGVar9) && (pGVar9 < pGVar4 + p->nObjs)) {
          uVar5 = (int)((long)pGVar9 - (long)pGVar4 >> 2) * -0x55555555;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,uVar5 + 1,uVar6);
          if (((int)uVar5 < 0) || (pVVar10->nSize <= (int)uVar5)) goto LAB_00745716;
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pObj) && (pObj < pGVar4 + p->nObjs)) {
            iVar3 = pVVar10->pArray[uVar5 & 0x7fffffff];
            uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
            pVVar10 = p->vLevels;
            Vec_IntFillExtra(pVVar10,uVar6 + 1,Fill_04);
            if ((-1 < (int)uVar6) && ((int)uVar6 < pVVar10->nSize)) {
              if (iVar11 < iVar2) {
                iVar11 = iVar2;
              }
              if (iVar11 <= iVar3) {
                iVar11 = iVar3;
              }
              pVVar10->pArray[uVar6 & 0x7fffffff] = iVar11 + 2;
              return;
            }
LAB_00745735:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
      }
    }
  }
LAB_007456f7:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }